

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O1

Vector<double,_2,_true> __thiscall
Nova::Vector<double,_2,_true>::operator-(Vector<double,_2,_true> *this,double a)

{
  long lVar1;
  Vector<double,_2,_true> *in_RSI;
  Vector<double,_2,_true> VVar2;
  
  Vector(this,in_RSI);
  lVar1 = 0;
  do {
    VVar2._data._M_elems[0] = *(double *)((long)(this->_data)._M_elems + lVar1) - a;
    *(double *)((long)(this->_data)._M_elems + lVar1) = VVar2._data._M_elems[0];
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x10);
  VVar2._data._M_elems[1] = a;
  return (Vector<double,_2,_true>)VVar2._data._M_elems;
}

Assistant:

Vector operator-(T a) const
    {
        Vector data_copy(*this);
        data_copy-=a;
        return data_copy;
    }